

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

uchar mbedtls_ct_base64_enc_char(uchar value)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uchar unaff_retaddr;
  uchar unaff_retaddr_00;
  uchar digit;
  
  bVar1 = mbedtls_ct_uchar_in_range_if(value,digit,unaff_retaddr_00,unaff_retaddr);
  bVar2 = mbedtls_ct_uchar_in_range_if(value,digit,unaff_retaddr_00,unaff_retaddr);
  bVar3 = mbedtls_ct_uchar_in_range_if(value,digit,unaff_retaddr_00,unaff_retaddr);
  bVar4 = mbedtls_ct_uchar_in_range_if(value,digit,unaff_retaddr_00,unaff_retaddr);
  bVar5 = mbedtls_ct_uchar_in_range_if(value,digit,unaff_retaddr_00,unaff_retaddr);
  return bVar1 | bVar2 | bVar3 | bVar4 | bVar5;
}

Assistant:

MBEDTLS_STATIC_TESTABLE
unsigned char mbedtls_ct_base64_enc_char(unsigned char value)
{
    unsigned char digit = 0;
    /* For each range of values, if value is in that range, mask digit with
     * the corresponding value. Since value can only be in a single range,
     * only at most one masking will change digit. */
    digit |= mbedtls_ct_uchar_in_range_if(0, 25, value, 'A' + value);
    digit |= mbedtls_ct_uchar_in_range_if(26, 51, value, 'a' + value - 26);
    digit |= mbedtls_ct_uchar_in_range_if(52, 61, value, '0' + value - 52);
    digit |= mbedtls_ct_uchar_in_range_if(62, 62, value, '+');
    digit |= mbedtls_ct_uchar_in_range_if(63, 63, value, '/');
    return digit;
}